

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O3

void __thiscall Symbol_Table::set_data(Symbol_Table *this,string *name,string *type,string *kind)

{
  int iVar1;
  mapped_type pIVar2;
  mapped_type *ppIVar3;
  
  pIVar2 = (mapped_type)operator_new(0x48);
  (pIVar2->type)._M_dataplus._M_p = (pointer)&(pIVar2->type).field_2;
  (pIVar2->type)._M_string_length = 0;
  (pIVar2->type).field_2._M_local_buf[0] = '\0';
  (pIVar2->kind)._M_dataplus._M_p = (pointer)&(pIVar2->kind).field_2;
  (pIVar2->kind)._M_string_length = 0;
  (pIVar2->kind).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)pIVar2);
  std::__cxx11::string::_M_assign((string *)&pIVar2->kind);
  iVar1 = std::__cxx11::string::compare((char *)kind);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)kind);
    if (iVar1 != 0) {
      ppIVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
                ::operator[](&this->class_scope,name);
      *ppIVar3 = pIVar2;
      iVar1 = std::__cxx11::string::compare((char *)kind);
      if (iVar1 == 0) {
        iVar1 = this->field_count;
        this->field_count = iVar1 + 1;
      }
      else {
        iVar1 = this->static_count;
        this->static_count = iVar1 + 1;
      }
      goto LAB_001310da;
    }
  }
  ppIVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
            ::operator[](&this->subroutine_scope,name);
  *ppIVar3 = pIVar2;
  iVar1 = std::__cxx11::string::compare((char *)kind);
  if (iVar1 == 0) {
    iVar1 = this->arg_count;
    this->arg_count = iVar1 + 1;
  }
  else {
    iVar1 = this->var_count;
    this->var_count = iVar1 + 1;
  }
LAB_001310da:
  pIVar2->index = iVar1;
  return;
}

Assistant:

void Symbol_Table::set_data(const std::string& name, const std::string& type, const std::string& kind) {
    auto *identifier_data = new IdentifierData;
    identifier_data->type = type;
    identifier_data->kind = kind;

    if (kind == "ARG" || kind == "VAR") {
        subroutine_scope[name] = identifier_data;
        if (kind == "ARG") {
            identifier_data->index = arg_count++;
        }
        else {
            identifier_data->index = var_count++;
        }
    }
    else {
        class_scope[name] = identifier_data;
        if (kind == "FIELD") {
            identifier_data->index = field_count++;
        }
        else {
            identifier_data->index = static_count++;
        }
    }
}